

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_main.c
# Opt level: O2

void sys_doflags(void)

{
  char cVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  void *__dest;
  void *pvVar6;
  char **argv;
  char cVar7;
  void *__ptr;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  ulong uStack_430;
  char local_418 [1000];
  
  if (sys_flags == (t_symbol *)0x0) {
    sys_flags = &s_;
  }
  pcVar8 = sys_flags->s_name;
  sVar4 = strlen(pcVar8);
  if (1000 < (int)sVar4) {
    pd_error((void *)0x0,"flags: %s: too long",pcVar8);
    return;
  }
  sVar4 = strlen(pcVar8);
  if ((int)sVar4 < 1000) {
    uVar10 = 0;
    memset(local_418,0,1000);
    memcpy(local_418,pcVar8,(long)(int)sVar4);
    pcVar8 = local_418;
    __ptr = (void *)0x0;
    while( true ) {
      cVar7 = *pcVar8;
      uVar11 = uVar10 * 8 + 8;
      if (cVar7 == '\0') break;
      pcVar5 = pcVar8;
      pcVar13 = pcVar8;
      cVar1 = '\0';
      while (cVar7 != '\0') {
        pcVar12 = pcVar5 + 1;
        if ((cVar7 == '\t' || cVar7 == ' ') && cVar1 == '\0') goto LAB_0016fa4b;
        if (cVar7 == '\\') {
          cVar7 = *pcVar12;
          if (cVar7 == '\0') {
            uStack_430 = 0xfffffffffffffff6;
            goto LAB_0016facf;
          }
          pcVar12 = pcVar5 + 2;
LAB_0016fa21:
          *pcVar13 = cVar7;
          pcVar13 = pcVar13 + 1;
          cVar2 = cVar1;
        }
        else if (cVar1 == cVar7) {
          cVar2 = '\0';
        }
        else if ((cVar1 != '\0') || ((cVar2 = cVar7, cVar7 != '\"' && (cVar7 != '\''))))
        goto LAB_0016fa21;
        pcVar5 = pcVar12;
        cVar1 = cVar2;
        cVar7 = *pcVar12;
      }
      pcVar12 = pcVar5;
      if (cVar1 != '\0') {
        uStack_430 = 0xfffffffffffffff5;
        goto LAB_0016facf;
      }
LAB_0016fa4b:
      pcVar5 = pcVar13;
      if (pcVar12 != pcVar13) goto LAB_0016fa68;
      while ((pcVar5 = pcVar12, *pcVar5 == ' ' || (*pcVar5 == '\t'))) {
        pcVar12 = pcVar5 + 1;
LAB_0016fa68:
        *pcVar5 = '\0';
      }
      __dest = calloc(((long)pcVar13 - (long)pcVar8) + 1,1);
      if (__dest == (void *)0x0) {
        uStack_430 = 0xffffffffffffffea;
        goto LAB_0016facf;
      }
      memcpy(__dest,pcVar8,(long)pcVar13 - (long)pcVar8);
      pvVar6 = realloc(__ptr,uVar11);
      if (pvVar6 == (void *)0x0) {
        free(__dest);
        uStack_430 = 0xffffffffffffffe9;
        goto LAB_0016facf;
      }
      *(void **)((long)pvVar6 + uVar10 * 8) = __dest;
      uVar10 = uVar10 + 1;
      pcVar8 = pcVar5;
      __ptr = pvVar6;
    }
    argv = (char **)realloc(__ptr,uVar11 & 0x7fffffff8);
    if (argv != (char **)0x0) {
      argv[uVar10 & 0xffffffff] = (char *)0x0;
      iVar3 = sys_argparse((int)uVar10,argv);
      if (iVar3 != 0) {
        pd_error((void *)0x0,"error parsing startup arguments");
      }
      uVar9 = 0;
      uVar11 = uVar10 & 0xffffffff;
      if ((int)uVar10 < 1) {
        uVar11 = uVar9;
      }
      for (; uVar11 != uVar9; uVar9 = uVar9 + 1) {
        free(argv[uVar9]);
      }
      free(argv);
      return;
    }
    uStack_430 = 0xffffffffffffffe9;
  }
  else {
    uStack_430 = 0xffffffffffffffff;
    __ptr = (void *)0x0;
  }
LAB_0016facf:
  free(__ptr);
  pd_error((void *)0x0,"error#%d while parsing flags",uStack_430 & 0xffffffff);
  return;
}

Assistant:

void sys_doflags(void)
{
    int rcargc=0;
    const char**rcargv = NULL;
    int len;
    int rcode = 0;
    if (!sys_flags)
        sys_flags = &s_;
    len = (int)strlen(sys_flags->s_name);
    if (len > MAXPDSTRING)
    {
        pd_error(0, "flags: %s: too long", sys_flags->s_name);
        return;
    }
    rcode = string2args(sys_flags->s_name, &rcargc, &rcargv);
    if(rcode < 0) {
        pd_error(0, "error#%d while parsing flags", rcode);
        return;
    }

    if (sys_argparse(rcargc, rcargv))
        pd_error(0, "error parsing startup arguments");

    for(len=0; len<rcargc; len++)
        free((void*)rcargv[len]);
    free(rcargv);
}